

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readCppStyleComment(OurReader *this)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = this->current_;
  while( true ) {
    if (pcVar2 == this->end_) {
      return true;
    }
    this->current_ = pcVar2 + 1;
    cVar1 = *pcVar2;
    if (cVar1 == '\n') break;
    pcVar2 = pcVar2 + 1;
    if (cVar1 == '\r') {
      pcVar2 = this->current_;
      if ((pcVar2 != this->end_) && (*pcVar2 == '\n')) {
        this->current_ = pcVar2 + 1;
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool OurReader::readCppStyleComment() {
  while (current_ != end_) {
    Char c = getNextChar();
    if (c == '\n')
      break;
    if (c == '\r') {
      // Consume DOS EOL. It will be normalized in addComment.
      if (current_ != end_ && *current_ == '\n')
        getNextChar();
      // Break on Moc OS 9 EOL.
      break;
    }
  }
  return true;
}